

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O3

void __thiscall
lzham::lzcompressor::node::add_state
          (node *this,int parent_index,int parent_state_index,lzdecision *lzdec,state *parent_state,
          bit_cost_t total_cost,uint total_complexity)

{
  node_state *pnVar1;
  state_base *psVar2;
  ulong uVar3;
  bool bVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bit_cost_t bVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  bit_cost_t bVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  int iVar21;
  uint uVar22;
  uint *puVar23;
  node_state *pnVar24;
  long lVar25;
  state_base local_80 [2];
  undefined1 uStack_39;
  undefined7 uStack_38;
  
  local_80[0].m_cur_ofs = (parent_state->super_state_base).m_cur_ofs;
  local_80[0].m_cur_state = (parent_state->super_state_base).m_cur_state;
  local_80[0].m_match_hist._0_8_ = *(undefined8 *)(parent_state->super_state_base).m_match_hist;
  local_80[0].m_match_hist._8_8_ =
       *(undefined8 *)((parent_state->super_state_base).m_match_hist + 2);
  state_base::partial_advance(local_80,lzdec);
  uVar19 = this->m_num_node_states;
  uVar22 = uVar19 - 1;
  uVar20 = (ulong)uVar19;
  if (-1 < (int)uVar22) {
    puVar23 = this->m_node_states[uVar22].m_saved_state.m_match_hist;
    uVar20 = (ulong)uVar22;
    uVar22 = uVar19;
    do {
      if (this->m_node_states[uVar20].m_saved_state.m_cur_state == local_80[0].m_cur_state) {
        pnVar24 = this->m_node_states + uVar20;
        lVar25 = 0;
        while (puVar23[lVar25] == local_80[0].m_match_hist[lVar25]) {
          lVar25 = lVar25 + 1;
          if (lVar25 == 4) {
            if (pnVar24->m_total_cost <= total_cost) {
              if (pnVar24->m_total_cost != total_cost) {
                return;
              }
              if (pnVar24->m_total_complexity <= total_complexity) {
                return;
              }
            }
            pnVar24->m_parent_index = (int16)parent_index;
            pnVar24->m_parent_state_index = (int8)parent_state_index;
            iVar21 = lzdec->m_len;
            (pnVar24->m_lzdec).m_pos = lzdec->m_pos;
            (pnVar24->m_lzdec).m_len = iVar21;
            (pnVar24->m_lzdec).m_dist = lzdec->m_dist;
            pnVar24->m_total_cost = total_cost;
            pnVar24->m_total_complexity = total_complexity;
            if ((long)uVar20 < 1) {
              return;
            }
            uVar20 = uVar20 & 0xffffffff;
            pnVar24 = this->m_node_states + uVar20;
            do {
              uVar20 = uVar20 - 1;
              pnVar1 = this->m_node_states + (uVar20 & 0xffffffff);
              uVar3 = this->m_node_states[uVar20 & 0xffffffff].m_total_cost;
              if (uVar3 <= pnVar24->m_total_cost) {
                if (pnVar24->m_total_cost != uVar3) {
                  return;
                }
                if (pnVar1->m_total_complexity <= pnVar24->m_total_complexity) {
                  return;
                }
              }
              uVar5._0_4_ = pnVar24->m_total_complexity;
              uVar5._4_2_ = pnVar24->m_parent_index;
              uVar5._6_1_ = pnVar24->m_parent_state_index;
              uVar5._7_1_ = pnVar24->field_0x37;
              uStack_38 = (undefined7)uVar5;
              iVar17 = (pnVar24->m_lzdec).m_pos;
              iVar18 = (pnVar24->m_lzdec).m_len;
              uVar5 = *(undefined8 *)&(pnVar24->m_lzdec).m_dist;
              uVar15 = (pnVar24->m_saved_state).m_cur_state;
              uVar16 = (pnVar24->m_saved_state).m_match_hist[0];
              uVar6 = *(undefined8 *)((pnVar24->m_saved_state).m_match_hist + 1);
              uVar7 = *(undefined8 *)((pnVar24->m_saved_state).m_match_hist + 3);
              bVar8 = pnVar24->m_total_cost;
              uStack_39 = (undefined1)(bVar8 >> 0x38);
              *(undefined8 *)((long)&pnVar24->m_total_cost + 7) =
                   *(undefined8 *)((long)&pnVar1->m_total_cost + 7);
              iVar21 = (pnVar1->m_lzdec).m_pos;
              iVar14 = (pnVar1->m_lzdec).m_len;
              uVar9 = *(undefined8 *)&(pnVar1->m_lzdec).m_dist;
              uVar12 = (pnVar1->m_saved_state).m_cur_state;
              uVar13 = (pnVar1->m_saved_state).m_match_hist[0];
              uVar10 = *(undefined8 *)((pnVar1->m_saved_state).m_match_hist + 1);
              bVar11 = pnVar1->m_total_cost;
              *(undefined8 *)((pnVar24->m_saved_state).m_match_hist + 3) =
                   *(undefined8 *)((pnVar1->m_saved_state).m_match_hist + 3);
              pnVar24->m_total_cost = bVar11;
              (pnVar24->m_saved_state).m_cur_state = uVar12;
              (pnVar24->m_saved_state).m_match_hist[0] = uVar13;
              *(undefined8 *)((pnVar24->m_saved_state).m_match_hist + 1) = uVar10;
              (pnVar24->m_lzdec).m_pos = iVar21;
              (pnVar24->m_lzdec).m_len = iVar14;
              *(undefined8 *)&(pnVar24->m_lzdec).m_dist = uVar9;
              *(undefined8 *)((pnVar1->m_saved_state).m_match_hist + 3) = uVar7;
              pnVar1->m_total_cost = bVar8;
              *(ulong *)((long)&pnVar1->m_total_cost + 7) = CONCAT71(uStack_38,uStack_39);
              (pnVar1->m_saved_state).m_cur_state = uVar15;
              (pnVar1->m_saved_state).m_match_hist[0] = uVar16;
              *(undefined8 *)((pnVar1->m_saved_state).m_match_hist + 1) = uVar6;
              (pnVar1->m_lzdec).m_pos = iVar17;
              (pnVar1->m_lzdec).m_len = iVar18;
              *(undefined8 *)&(pnVar1->m_lzdec).m_dist = uVar5;
              uVar22 = uVar22 - 1;
              pnVar24 = pnVar24 + -1;
              if ((int)uVar22 < 2) {
                return;
              }
            } while( true );
          }
        }
      }
      uVar22 = uVar22 - 1;
      puVar23 = puVar23 + -0xe;
      bVar4 = 0 < (long)uVar20;
      uVar20 = uVar20 - 1;
    } while (bVar4);
    uVar20 = (ulong)uVar19;
    if (0 < (int)uVar19) {
      puVar23 = &this->m_node_states[(ulong)uVar19 - 1].m_total_complexity;
      uVar20 = (ulong)uVar19;
      do {
        if ((*(ulong *)(puVar23 + -2) < total_cost) ||
           ((*(ulong *)(puVar23 + -2) == total_cost && (*puVar23 <= total_complexity)))) {
          if (uVar20 == 4) {
            return;
          }
          goto LAB_0010df3b;
        }
        puVar23 = puVar23 + -0xe;
        bVar4 = 1 < uVar20;
        uVar20 = uVar20 - 1;
      } while (bVar4);
      uVar20 = 0;
    }
  }
LAB_0010df3b:
  iVar21 = (int)uVar20;
  uVar22 = (uVar19 - iVar21) - (uint)(3 < uVar19);
  if (uVar22 != 0) {
    memmove(this->m_node_states + (iVar21 + 1),this->m_node_states + iVar21,(ulong)uVar22 * 0x38);
    uVar19 = this->m_num_node_states;
  }
  this->m_node_states[iVar21].m_parent_index = (int16)parent_index;
  this->m_node_states[iVar21].m_parent_state_index = (int8)parent_state_index;
  iVar14 = lzdec->m_len;
  this->m_node_states[iVar21].m_lzdec.m_pos = lzdec->m_pos;
  this->m_node_states[iVar21].m_lzdec.m_len = iVar14;
  this->m_node_states[iVar21].m_lzdec.m_dist = lzdec->m_dist;
  this->m_node_states[iVar21].m_total_cost = total_cost;
  this->m_node_states[iVar21].m_total_complexity = total_complexity;
  psVar2 = &this->m_node_states[iVar21].m_saved_state;
  psVar2->m_cur_ofs = local_80[0].m_cur_ofs;
  psVar2->m_cur_state = local_80[0].m_cur_state;
  *(undefined8 *)psVar2->m_match_hist = local_80[0].m_match_hist._0_8_;
  *(undefined8 *)(this->m_node_states[iVar21].m_saved_state.m_match_hist + 2) =
       local_80[0].m_match_hist._8_8_;
  uVar22 = 4;
  if (uVar19 + 1 < 4) {
    uVar22 = uVar19 + 1;
  }
  this->m_num_node_states = uVar22;
  return;
}

Assistant:

void lzcompressor::node::add_state(
      int parent_index, int parent_state_index,
      const lzdecision &lzdec, state &parent_state,
      bit_cost_t total_cost,
      uint total_complexity)
   {
      state_base trial_state;
      parent_state.save_partial_state(trial_state);
      trial_state.partial_advance(lzdec);

      for (int i = m_num_node_states - 1; i >= 0; i--)
      {
         node_state &cur_node_state = m_node_states[i];
         if (cur_node_state.m_saved_state == trial_state)
         {
            if ( (total_cost < cur_node_state.m_total_cost) ||
                 ((total_cost == cur_node_state.m_total_cost) && (total_complexity < cur_node_state.m_total_complexity)) )
            {
               cur_node_state.m_parent_index = static_cast<int16>(parent_index);
               cur_node_state.m_parent_state_index = static_cast<int8>(parent_state_index);
               cur_node_state.m_lzdec = lzdec;
               cur_node_state.m_total_cost = total_cost;
               cur_node_state.m_total_complexity = total_complexity;

               while (i > 0)
               {
                  if ((m_node_states[i].m_total_cost < m_node_states[i - 1].m_total_cost) ||
                      ((m_node_states[i].m_total_cost == m_node_states[i - 1].m_total_cost) && (m_node_states[i].m_total_complexity < m_node_states[i - 1].m_total_complexity)))
                  {
                     std::swap(m_node_states[i], m_node_states[i - 1]);
                     i--;
                  }
                  else
                     break;
               }
            }

            return;
         }
      }

      int insert_index;
      for (insert_index = m_num_node_states; insert_index > 0; insert_index--)
      {
         node_state &cur_node_state = m_node_states[insert_index - 1];

         if ( (total_cost > cur_node_state.m_total_cost) ||
              ((total_cost == cur_node_state.m_total_cost) && (total_complexity >= cur_node_state.m_total_complexity)) )
         {
            break;
         }
      }

      if (insert_index == cMaxNodeStates)
         return;

      uint num_behind = m_num_node_states - insert_index;
      uint num_to_move = (m_num_node_states < cMaxNodeStates) ? num_behind : (num_behind - 1);
      if (num_to_move)
      {
         LZHAM_ASSERT((insert_index + 1 + num_to_move) <= cMaxNodeStates);
         memmove( &m_node_states[insert_index + 1], &m_node_states[insert_index], sizeof(node_state) * num_to_move);
      }

      node_state *pNew_node_state = &m_node_states[insert_index];
      pNew_node_state->m_parent_index = static_cast<int16>(parent_index);
      pNew_node_state->m_parent_state_index = static_cast<uint8>(parent_state_index);
      pNew_node_state->m_lzdec = lzdec;
      pNew_node_state->m_total_cost = total_cost;
      pNew_node_state->m_total_complexity = total_complexity;
      pNew_node_state->m_saved_state = trial_state;

      m_num_node_states = LZHAM_MIN(m_num_node_states + 1, cMaxNodeStates);

#ifdef LZHAM_LZVERIFY
      for (uint i = 0; i < (m_num_node_states - 1); ++i)
      {
         node_state &a = m_node_states[i];
         node_state &b = m_node_states[i + 1];
         LZHAM_VERIFY(
            (a.m_total_cost < b.m_total_cost) ||
            ((a.m_total_cost == b.m_total_cost) && (a.m_total_complexity <= b.m_total_complexity)) );
      }
#endif
   }